

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O2

mat4 * __thiscall rengine::mat4::inverted(mat4 *__return_storage_ptr__,mat4 *this,bool *invertible)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int i;
  long lVar7;
  float *pfVar8;
  mat4 *pmVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_11c [16];
  undefined4 local_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_dc = 0;
  local_10 = this->m[10];
  local_c = this->m[5];
  local_2c = this->m[6];
  local_50 = this->m[0xf];
  local_24 = this->m[0xb];
  local_1c = this->m[0xe];
  fVar1 = this->m[9];
  local_48 = this->m[7];
  local_3c = this->m[0xd];
  local_7c = (local_2c * local_3c * local_24 +
             fVar1 * local_48 * local_1c +
             ((local_c * local_10 * local_50 - local_24 * local_c * local_1c) -
             local_2c * fVar1 * local_50)) - local_48 * local_3c * local_10;
  local_11c[0] = local_7c;
  fVar2 = this->m[4];
  fVar3 = this->m[8];
  fVar4 = this->m[0xc];
  local_78 = local_48 * fVar4 * local_10 +
             (((local_2c * fVar3 * local_50 +
               (local_1c * local_24 * fVar2 - local_10 * fVar2 * local_50)) -
              local_48 * fVar3 * local_1c) - local_2c * fVar4 * local_24);
  local_11c[8] = (local_c * fVar4 * local_24 +
                 local_48 * fVar3 * local_3c +
                 ((fVar1 * fVar2 * local_50 - local_24 * fVar2 * local_3c) -
                 local_c * fVar3 * local_50)) - local_48 * fVar4 * fVar1;
  local_11c[0xc] =
       local_2c * fVar4 * fVar1 +
       (((local_c * fVar3 * local_1c + (local_10 * fVar2 * local_3c - fVar1 * fVar2 * local_1c)) -
        local_2c * fVar3 * local_3c) - local_c * fVar4 * local_10);
  local_11c[4] = local_78;
  local_18 = this->m[1];
  fVar5 = this->m[2];
  local_4c = this->m[3];
  local_74 = fVar1 * local_4c;
  local_70 = local_3c * fVar5;
  local_6c = local_3c * local_4c;
  local_11c[1] = local_6c * local_10 +
                 (((fVar1 * fVar5 * local_50 +
                   (local_24 * local_18 * local_1c - local_10 * local_18 * local_50)) -
                  local_74 * local_1c) - local_70 * local_24);
  fVar6 = this->m[0];
  local_68 = local_10 * fVar6;
  fVar11 = -fVar2;
  fVar13 = -fVar3;
  fVar12 = -fVar4;
  local_58 = local_4c * fVar12;
  local_44 = local_18 * fVar12;
  local_40 = local_c * fVar5;
  local_38 = local_18 * fVar11;
  local_20 = local_11c[8] * fVar5;
  local_11c[5] = local_58 * local_10 +
                 fVar4 * fVar5 * local_24 +
                 fVar3 * local_4c * local_1c +
                 fVar5 * fVar13 * local_50 + (local_68 * local_50 - local_1c * local_24 * fVar6);
  fVar10 = -fVar6;
  local_54 = local_1c * local_48 * fVar6;
  local_5c = local_48 * fVar6 * fVar1;
  local_60 = local_4c * fVar11 * fVar1;
  local_64 = local_2c * fVar10 * fVar1;
  local_34 = local_c * local_4c;
  local_d8 = fVar2 * local_4c;
  uStack_d4 = 0;
  uStack_d0 = 0;
  uStack_cc = 0;
  local_30 = local_11c[0xc] * local_4c;
  local_11c[9] = fVar4 * local_4c * fVar1 +
                 local_44 * local_24 +
                 local_4c * fVar13 * local_3c +
                 fVar3 * local_18 * local_50 +
                 (local_24 * fVar6 * local_3c - fVar1 * fVar6 * local_50);
  local_11c[0xd] =
       fVar12 * fVar5 * fVar1 +
       fVar4 * local_18 * local_10 +
       fVar3 * fVar5 * local_3c +
       fVar13 * local_18 * local_1c + (fVar1 * fVar6 * local_1c - local_68 * local_3c);
  local_11c[2] = (local_70 * local_48 +
                 local_34 * local_1c +
                 ((local_2c * local_18 * local_50 - local_1c * local_48 * local_18) -
                 local_40 * local_50)) - local_6c * local_2c;
  local_11c[6] = fVar4 * local_4c * local_2c +
                 fVar12 * fVar5 * local_48 +
                 local_4c * fVar11 * local_1c +
                 fVar2 * fVar5 * local_50 + local_2c * fVar10 * local_50 + local_54;
  local_28 = fVar1 * fVar5 * local_48;
  fVar12 = fVar3 * fVar5 * local_48;
  local_c8 = ZEXT416((uint)fVar12);
  local_98 = fVar13 * local_18 * local_48;
  uStack_94 = 0x80000000;
  uStack_90 = 0x80000000;
  uStack_8c = 0x80000000;
  local_a8 = fVar3 * local_4c * local_c;
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  local_14 = fVar5 * fVar13 * local_c;
  local_11c[10] =
       local_58 * local_c +
       fVar4 * local_18 * local_48 +
       local_d8 * local_3c +
       local_50 * local_38 + local_c * fVar6 * local_50 + local_3c * local_48 * fVar10;
  local_b8 = fVar3 * local_18 * local_2c;
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_11c[0xe] =
       fVar4 * fVar5 * local_c +
       local_44 * local_2c +
       local_3c * fVar11 * fVar5 +
       local_1c * fVar2 * local_18 + fVar10 * local_c * local_1c + local_3c * local_2c * fVar6;
  local_11c[3] = local_74 * local_2c +
                 (((local_40 * local_24 +
                   (local_48 * local_18 * local_10 - local_2c * local_18 * local_24)) -
                  local_34 * local_10) - local_28);
  local_11c[7] = local_4c * fVar13 * local_2c +
                 fVar12 + local_d8 * local_10 +
                          fVar11 * fVar5 * local_24 +
                          local_2c * fVar6 * local_24 + local_48 * fVar10 * local_10;
  local_11c[0xb] =
       local_a8 +
       local_98 + local_60 + fVar2 * local_18 * local_24 + fVar10 * local_c * local_24 + local_5c;
  local_11c[0xf] =
       local_14 +
       local_b8 +
       fVar2 * fVar5 * fVar1 + local_38 * local_10 + local_c * fVar6 * local_10 + local_64;
  local_30 = local_30 + local_20 + local_7c * fVar6 + local_78 * local_18;
  if ((local_30 != 0.0) || (NAN(local_30))) {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      local_11c[lVar7] = local_11c[lVar7] * (1.0 / local_30);
    }
    if (invertible != (bool *)0x0) {
      *invertible = true;
    }
    pfVar8 = local_11c;
    pmVar9 = __return_storage_ptr__;
    for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
      pmVar9->m[0] = *pfVar8;
      pfVar8 = pfVar8 + 1;
      pmVar9 = (mat4 *)(pmVar9->m + 1);
    }
  }
  else {
    if (invertible != (bool *)0x0) {
      *invertible = false;
    }
    __return_storage_ptr__->m[0xc] = 0.0;
    __return_storage_ptr__->m[0xd] = 0.0;
    __return_storage_ptr__->m[0xe] = 0.0;
    __return_storage_ptr__->m[0xf] = 1.0;
    __return_storage_ptr__->m[8] = 0.0;
    __return_storage_ptr__->m[9] = 0.0;
    __return_storage_ptr__->m[10] = 1.0;
    __return_storage_ptr__->m[0xb] = 0.0;
    __return_storage_ptr__->m[4] = 0.0;
    __return_storage_ptr__->m[5] = 1.0;
    __return_storage_ptr__->m[6] = 0.0;
    __return_storage_ptr__->m[7] = 0.0;
    __return_storage_ptr__->m[0] = 1.0;
    __return_storage_ptr__->m[1] = 0.0;
    __return_storage_ptr__->m[2] = 0.0;
    __return_storage_ptr__->m[3] = 0.0;
    __return_storage_ptr__->type = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 inverted(bool *invertible) const {
        mat4 inv;
        inv.m[0] = m[5]  * m[10] * m[15] -
                   m[5]  * m[11] * m[14] -
                   m[9]  * m[6]  * m[15] +
                   m[9]  * m[7]  * m[14] +
                   m[13] * m[6]  * m[11] -
                   m[13] * m[7]  * m[10];
        inv.m[4] = -m[4]  * m[10] * m[15] +
                    m[4]  * m[11] * m[14] +
                    m[8]  * m[6]  * m[15] -
                    m[8]  * m[7]  * m[14] -
                    m[12] * m[6]  * m[11] +
                    m[12] * m[7]  * m[10];
        inv.m[8] = m[4]  * m[9] * m[15] -
                   m[4]  * m[11] * m[13] -
                   m[8]  * m[5] * m[15] +
                   m[8]  * m[7] * m[13] +
                   m[12] * m[5] * m[11] -
                   m[12] * m[7] * m[9];
        inv.m[12] = -m[4]  * m[9] * m[14] +
                     m[4]  * m[10] * m[13] +
                     m[8]  * m[5] * m[14] -
                     m[8]  * m[6] * m[13] -
                     m[12] * m[5] * m[10] +
                     m[12] * m[6] * m[9];
        inv.m[1] = -m[1]  * m[10] * m[15] +
                    m[1]  * m[11] * m[14] +
                    m[9]  * m[2] * m[15] -
                    m[9]  * m[3] * m[14] -
                    m[13] * m[2] * m[11] +
                    m[13] * m[3] * m[10];
        inv.m[5] = m[0]  * m[10] * m[15] -
                   m[0]  * m[11] * m[14] -
                   m[8]  * m[2] * m[15] +
                   m[8]  * m[3] * m[14] +
                   m[12] * m[2] * m[11] -
                   m[12] * m[3] * m[10];
        inv.m[9] = -m[0]  * m[9] * m[15] +
                    m[0]  * m[11] * m[13] +
                    m[8]  * m[1] * m[15] -
                    m[8]  * m[3] * m[13] -
                    m[12] * m[1] * m[11] +
                    m[12] * m[3] * m[9];
        inv.m[13] = m[0]  * m[9] * m[14] -
                    m[0]  * m[10] * m[13] -
                    m[8]  * m[1] * m[14] +
                    m[8]  * m[2] * m[13] +
                    m[12] * m[1] * m[10] -
                    m[12] * m[2] * m[9];
        inv.m[2] = m[1]  * m[6] * m[15] -
                    m[1]  * m[7] * m[14] -
                    m[5]  * m[2] * m[15] +
                    m[5]  * m[3] * m[14] +
                    m[13] * m[2] * m[7] -
                    m[13] * m[3] * m[6];
        inv.m[6] = -m[0]  * m[6] * m[15] +
                    m[0]  * m[7] * m[14] +
                    m[4]  * m[2] * m[15] -
                    m[4]  * m[3] * m[14] -
                    m[12] * m[2] * m[7] +
                    m[12] * m[3] * m[6];
        inv.m[10] = m[0]  * m[5] * m[15] -
                    m[0]  * m[7] * m[13] -
                    m[4]  * m[1] * m[15] +
                    m[4]  * m[3] * m[13] +
                    m[12] * m[1] * m[7] -
                    m[12] * m[3] * m[5];
        inv.m[14] = -m[0]  * m[5] * m[14] +
                     m[0]  * m[6] * m[13] +
                     m[4]  * m[1] * m[14] -
                     m[4]  * m[2] * m[13] -
                     m[12] * m[1] * m[6] +
                     m[12] * m[2] * m[5];
        inv.m[3] = -m[1] * m[6] * m[11] +
                    m[1] * m[7] * m[10] +
                    m[5] * m[2] * m[11] -
                    m[5] * m[3] * m[10] -
                    m[9] * m[2] * m[7] +
                    m[9] * m[3] * m[6];
        inv.m[7] = m[0] * m[6] * m[11] -
                   m[0] * m[7] * m[10] -
                   m[4] * m[2] * m[11] +
                   m[4] * m[3] * m[10] +
                   m[8] * m[2] * m[7] -
                   m[8] * m[3] * m[6];
        inv.m[11] = -m[0] * m[5] * m[11] +
                     m[0] * m[7] * m[9] +
                     m[4] * m[1] * m[11] -
                     m[4] * m[3] * m[9] -
                     m[8] * m[1] * m[7] +
                     m[8] * m[3] * m[5];
        inv.m[15] = m[0] * m[5] * m[10] -
                    m[0] * m[6] * m[9] -
                    m[4] * m[1] * m[10] +
                    m[4] * m[2] * m[9] +
                    m[8] * m[1] * m[6] -
                    m[8] * m[2] * m[5];

        float det = m[0] * inv.m[0] + m[1] * inv.m[4] + m[2] * inv.m[8] + m[3] * inv.m[12];

        if (det == 0) {
            if (invertible)
                *invertible = false;
            return mat4();
        }

        det = 1.0 / det;
        for (int i = 0; i < 16; i++)
            inv.m[i] *= det;

        if (invertible)
            *invertible = true;

        return inv;
    }